

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.h
# Opt level: O2

bitwidth_t __thiscall slang::SVInt::getActiveBits(SVInt *this)

{
  bitwidth_t bVar1;
  bitwidth_t bVar2;
  
  bVar1 = (this->super_SVIntStorage).bitWidth;
  bVar2 = countLeadingZeros(this);
  return bVar1 - bVar2;
}

Assistant:

bitwidth_t getActiveBits() const { return bitWidth - countLeadingZeros(); }